

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,uint32_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  pointer __p;
  int iVar4;
  long lVar5;
  uint32_t uVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  unique_ptr<char[],_std::default_delete<char[]>_> tmpSpace;
  
  sVar3 = anon_unknown_0::_GetEncodedBufferSize<int>(numInts);
  tmpSpace._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  if (workingSpace == (char *)0x0) {
    __p = (pointer)operator_new__(sVar3);
    ::std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&tmpSpace,__p);
    workingSpace = (char *)tmpSpace;
  }
  sVar3 = LZ4Compression::DecompressFromBuffer(compressed,workingSpace,compressedSize,sVar3,err);
  uVar6 = 0;
  if (sVar3 == 0) {
    numInts = 0;
switchD_00283004_caseD_0:
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmpSpace);
    return numInts;
  }
  iVar2 = *(int *)workingSpace;
  piVar7 = (int *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 4);
  pbVar10 = (byte *)((long)workingSpace + 4);
  sVar3 = numInts;
LAB_00282f90:
  switch(sVar3) {
  case 0:
    break;
  case 1:
    switch(*pbVar10 & 3) {
    case 1:
      iVar2 = (int)(char)*piVar7;
      break;
    case 2:
      iVar2 = (int)(short)*piVar7;
      break;
    case 3:
      iVar2 = *piVar7;
    }
    *ints = iVar2 + uVar6;
    break;
  case 2:
    bVar1 = *pbVar10;
    for (lVar5 = 0; (int)lVar5 != 4; lVar5 = lVar5 + 2) {
      switch(bVar1 >> ((byte)lVar5 & 0x1f) & 3) {
      case 0:
        iVar4 = iVar2;
        break;
      case 1:
        iVar4 = *piVar7;
        piVar7 = (int *)((long)piVar7 + 1);
        iVar4 = (int)(char)iVar4;
        break;
      case 2:
        iVar4 = *piVar7;
        piVar7 = (int *)((long)piVar7 + 2);
        iVar4 = (int)(short)iVar4;
        break;
      case 3:
        iVar4 = *piVar7;
        piVar7 = piVar7 + 1;
      }
      uVar6 = uVar6 + iVar4;
      *(uint32_t *)((long)ints + lVar5 * 2) = uVar6;
    }
    break;
  case 3:
    bVar1 = *pbVar10;
    for (lVar5 = 0; (int)lVar5 != 6; lVar5 = lVar5 + 2) {
      uVar8 = (3 << ((byte)lVar5 & 0x1f) & (uint)bVar1) >> ((byte)lVar5 & 0x1f);
      if (uVar8 == 3) {
        iVar4 = *piVar7;
        piVar7 = piVar7 + 1;
      }
      else if (uVar8 == 2) {
        iVar4 = *piVar7;
        piVar7 = (int *)((long)piVar7 + 2);
        iVar4 = (int)(short)iVar4;
      }
      else {
        iVar4 = iVar2;
        if (uVar8 == 1) {
          iVar4 = *piVar7;
          piVar7 = (int *)((long)piVar7 + 1);
          iVar4 = (int)(char)iVar4;
        }
      }
      uVar6 = uVar6 + iVar4;
      *(uint32_t *)((long)ints + lVar5 * 2) = uVar6;
    }
    break;
  default:
    goto switchD_00283004_default;
  }
  goto switchD_00283004_caseD_0;
switchD_00283004_default:
  bVar1 = *pbVar10;
  for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 2) {
    uVar8 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
    if (uVar8 == 3) {
      iVar9 = *piVar7;
      piVar7 = piVar7 + 1;
    }
    else if (uVar8 == 2) {
      iVar9 = *piVar7;
      piVar7 = (int *)((long)piVar7 + 2);
      iVar9 = (int)(short)iVar9;
    }
    else {
      iVar9 = iVar2;
      if (uVar8 == 1) {
        iVar9 = *piVar7;
        piVar7 = (int *)((long)piVar7 + 1);
        iVar9 = (int)(char)iVar9;
      }
    }
    uVar6 = uVar6 + iVar9;
    *ints = uVar6;
    ints = ints + 1;
  }
  pbVar10 = pbVar10 + 1;
  sVar3 = sVar3 - 4;
  goto LAB_00282f90;
}

Assistant:

size_t
Usd_IntegerCompression::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    uint32_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}